

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# banner.cpp
# Opt level: O3

void OutputBanner(ofstream *ostream,Banner *banner)

{
  char cVar1;
  long lVar2;
  
  cVar1 = (char)ostream;
  std::ostream::put(cVar1);
  std::ostream::put(cVar1);
  std::ostream::put(cVar1);
  std::ostream::put(cVar1);
  lVar2 = 6;
  do {
    std::ostream::put(cVar1);
    std::ostream::put(cVar1);
    lVar2 = lVar2 + -2;
  } while (lVar2 != 0);
  lVar2 = 0x16;
  do {
    std::ostream::put(cVar1);
    lVar2 = lVar2 + -1;
  } while (lVar2 != 0);
  lVar2 = 0;
  do {
    std::ostream::put(cVar1);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x200);
  lVar2 = 0;
  do {
    std::ostream::put(cVar1);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x20);
  lVar2 = 0;
  do {
    std::ostream::put(cVar1);
    std::ostream::put(cVar1);
    lVar2 = lVar2 + 2;
  } while (lVar2 != 0x100);
  lVar2 = 0;
  do {
    std::ostream::put(cVar1);
    std::ostream::put(cVar1);
    lVar2 = lVar2 + 2;
  } while (lVar2 != 0x100);
  lVar2 = 0;
  do {
    std::ostream::put(cVar1);
    std::ostream::put(cVar1);
    lVar2 = lVar2 + 2;
  } while (lVar2 != 0x100);
  lVar2 = 0;
  do {
    std::ostream::put(cVar1);
    std::ostream::put(cVar1);
    lVar2 = lVar2 + 2;
  } while (lVar2 != 0x100);
  lVar2 = 0;
  do {
    std::ostream::put(cVar1);
    std::ostream::put(cVar1);
    lVar2 = lVar2 + 2;
  } while (lVar2 != 0x100);
  lVar2 = 0;
  do {
    std::ostream::put(cVar1);
    std::ostream::put(cVar1);
    lVar2 = lVar2 + 2;
  } while (lVar2 != 0x100);
  return;
}

Assistant:

void OutputBanner(std::ofstream& ostream, const Banner& banner) {
    SerializeData<u16>(ostream, banner.version);
    SerializeData<u16>(ostream, banner.crc);

    for ([[maybe_unused]] u16 i : banner.crc_padding) {
        SerializeData<u16>(ostream, 0);
    }

    for ([[maybe_unused]] u8 i : banner.padding) {
        SerializeData<u8>(ostream, 0);
    }

    for (u8 i : banner.bitmap) {
        SerializeData<u8>(ostream, i);
    }

    for (u8 i : banner.palette) {
        SerializeData<u8>(ostream, i);
    }

    for (char16_t c : banner.japanese_title) {
        SerializeData<u16>(ostream, c);
    }

    for (char16_t c : banner.english_title) {
        SerializeData<u16>(ostream, c);
    }

    for (char16_t c : banner.french_title) {
        SerializeData<u16>(ostream, c);
    }

    for (char16_t c : banner.german_title) {
        SerializeData<u16>(ostream, c);
    }

    for (char16_t c : banner.italian_title) {
        SerializeData<u16>(ostream, c);
    }

    for (char16_t c : banner.spanish_title) {
        SerializeData<u16>(ostream, c);
    }
}